

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThreads.cpp
# Opt level: O0

void __thiscall
xmrig::CudaThreads::CudaThreads
          (CudaThreads *this,vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  bool bVar1;
  CudaDevice *in_RSI;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *in_RDI;
  CudaDevice *device;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *__range1;
  __normal_iterator<const_xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
  local_20;
  CudaDevice *this_00;
  
  std::vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>::vector
            ((vector<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_> *)0x2283cc);
  this_00 = in_RSI;
  local_20._M_current =
       (CudaDevice *)
       std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::begin(in_RDI);
  std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
    ::operator*(&local_20);
    CudaDevice::generate(this_00,(CudaThreads *)in_RSI);
    __gnu_cxx::
    __normal_iterator<const_xmrig::CudaDevice_*,_std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

xmrig::CudaThreads::CudaThreads(const std::vector<CudaDevice> &devices)
{
    for (const auto &device : devices) {
        device.generate(*this);
    }
}